

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

int rsa_generate(RSAKey *key,int bits,_Bool strong,PrimeGenerationContext *pgc,
                ProgressReceiver *prog)

{
  RSAPrimeDetails pd_00;
  RSAPrimeDetails pd_01;
  int bits_00;
  uint uVar1;
  uint uVar2;
  mp_int *x;
  mp_int *pmVar3;
  mp_int *pmVar4;
  mp_int *pmVar5;
  mp_int *pmVar6;
  uintmax_t uVar7;
  mp_int *pmVar8;
  mp_int *m;
  size_t sVar9;
  ulong n;
  int bits_01;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  RSAPrimeDetails qd;
  RSAPrimeDetails pd;
  
  (key->sshk).vt = &ssh_rsa;
  x = mp_from_integer(0x10001);
  bits_00 = bits / 2;
  bits_01 = bits - bits_00;
  if (bits_01 < bits_00) {
    __assert_fail("pbits >= qbits",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/rsa.c",
                  0x7d,
                  "int rsa_generate(RSAKey *, int, _Bool, PrimeGenerationContext *, ProgressReceiver *)"
                 );
  }
  setup_rsa_prime(&pd,bits_01,strong,pgc,prog);
  setup_rsa_prime(&qd,bits_00,strong,pgc,prog);
  (*prog->vt->ready)(prog);
  pmVar3 = mp_new(0x20);
  for (uVar13 = 0x2000fff; uVar13 != 0x2001fff; uVar13 = uVar13 + 1) {
    uVar1 = uVar13 / (uVar13 + 0xfe000001);
    if (uVar1 <= uVar13 + 0xfe000003) {
      uVar1 = uVar13 + 0xfe000003;
    }
    n = (ulong)(0x2000 - uVar1);
    if (0x2000 < uVar1) {
      n = 0;
    }
    mp_add_integer_into(pmVar3,pmVar3,n);
  }
  uVar1 = 0;
  pmVar4 = mp_from_integer(0);
  pmVar5 = mp_new(0x20);
  mp_lshift_fixed_into(pmVar5,pmVar3,1);
  pmVar6 = mp_random_in_range_fn(pmVar4,pmVar5,random_read);
  mp_free(pmVar4);
  mp_free(pmVar5);
  uVar13 = mp_get_bit(pmVar6,0);
  mp_rshift_fixed_into(pmVar6,pmVar6,1);
  uVar12 = 0;
  for (uVar10 = 0x2000fff; uVar10 != 0x2001fff; uVar10 = uVar10 + 1) {
    uVar11 = uVar10 / (uVar10 + 0xfe000001);
    if (uVar11 <= uVar10 + 0xfe000003) {
      uVar11 = uVar10 + 0xfe000003;
    }
    if (0x1fff < uVar11) {
      uVar11 = 0x2000;
    }
    uVar7 = mp_get_integer(pmVar6);
    uVar2 = mp_hs_integer(pmVar6,(ulong)(0x2000 - uVar11));
    uVar2 = (uVar2 ^ 0xfffffffe) + 1;
    uVar12 = uVar12 ^ (uVar10 + 0xfe000001 ^ uVar12) & uVar2;
    uVar1 = ((int)uVar7 + uVar11 ^ uVar1) & uVar2 ^ uVar1;
    mp_sub_integer_into(pmVar6,pmVar6,(ulong)(0x2000 - uVar11));
  }
  mp_free(pmVar6);
  mp_free(pmVar3);
  if (uVar12 < 0x1000) {
    __assert_fail("lo <= a",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/rsa.c",
                  0x114,"void invent_firstbits(unsigned int *, unsigned int *, unsigned int)");
  }
  if (uVar1 < 0x1000) {
    __assert_fail("lo <= b",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/rsa.c",
                  0x116,"void invent_firstbits(unsigned int *, unsigned int *, unsigned int)");
  }
  if (uVar1 < 0x2000) {
    if (uVar12 * uVar1 < 0x2000000) {
      __assert_fail("a * b >= minproduct",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/rsa.c"
                    ,0x118,"void invent_firstbits(unsigned int *, unsigned int *, unsigned int)");
    }
    if (uVar12 + 2 <= uVar1) {
      uVar13 = -uVar13 & (uVar12 ^ uVar1);
      pd.firstbits = uVar12 ^ uVar13;
      qd.firstbits = uVar13 ^ uVar1;
      pd_00.firstbits = pd.firstbits;
      pd_00.bitsp1 = pd.bitsp1;
      pd_00.bitsm1m1 = pd.bitsm1m1;
      pd_00.bitsm1 = pd.bitsm1;
      pd_00.strong = pd.strong;
      pd_00._1_3_ = pd._1_3_;
      pd_00.bits = pd.bits;
      pd_00.phase_main.p = pd.phase_main.p;
      pd_00.phase_m1m1.p = pd.phase_m1m1.p;
      pd_00.phase_m1.p = pd.phase_m1.p;
      pd_00.phase_p1.p = pd.phase_p1.p;
      pmVar3 = generate_rsa_prime(pd_00,pgc,prog);
      pd_01.firstbits = qd.firstbits;
      pd_01.bitsp1 = qd.bitsp1;
      pd_01.bitsm1m1 = qd.bitsm1m1;
      pd_01.bitsm1 = qd.bitsm1;
      pd_01.strong = qd.strong;
      pd_01._1_3_ = qd._1_3_;
      pd_01.bits = qd.bits;
      pd_01.phase_main.p = qd.phase_main.p;
      pd_01.phase_m1m1.p = qd.phase_m1m1.p;
      pd_01.phase_m1.p = qd.phase_m1.p;
      pd_01.phase_p1.p = qd.phase_p1.p;
      pmVar4 = generate_rsa_prime(pd_01,pgc,prog);
      if (bits_01 == bits_00) {
        uVar13 = mp_cmp_hs(pmVar4,pmVar3);
        mp_cond_swap(pmVar3,pmVar4,uVar13);
      }
      else {
        uVar13 = mp_cmp_hs(pmVar3,pmVar4);
        if (uVar13 == 0) {
          __assert_fail("mp_cmp_hs(p, q)",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/rsa.c"
                        ,0x92,
                        "int rsa_generate(RSAKey *, int, _Bool, PrimeGenerationContext *, ProgressReceiver *)"
                       );
        }
      }
      pmVar5 = mp_mul(pmVar3,pmVar4);
      pmVar6 = mp_copy(pmVar3);
      mp_sub_integer_into(pmVar6,pmVar6,1);
      pmVar8 = mp_copy(pmVar4);
      mp_sub_integer_into(pmVar8,pmVar8,1);
      m = mp_mul(pmVar6,pmVar8);
      mp_free(pmVar6);
      mp_free(pmVar8);
      pmVar6 = mp_invert(x,m);
      mp_free(m);
      pmVar8 = mp_invert(pmVar4,pmVar3);
      key->modulus = pmVar5;
      key->exponent = x;
      key->private_exponent = pmVar6;
      key->p = pmVar3;
      key->q = pmVar4;
      key->iqmp = pmVar8;
      sVar9 = mp_get_nbits(pmVar5);
      key->bits = (int)sVar9;
      key->bytes = ((int)sVar9 + 7) / 8;
      return 1;
    }
    __assert_fail("b >= a + min_separation",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/rsa.c",
                  0x119,"void invent_firstbits(unsigned int *, unsigned int *, unsigned int)");
  }
  __assert_fail("b < hi",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/rsa.c",
                0x117,"void invent_firstbits(unsigned int *, unsigned int *, unsigned int)");
}

Assistant:

int rsa_generate(RSAKey *key, int bits, bool strong,
                 PrimeGenerationContext *pgc, ProgressReceiver *prog)
{
    key->sshk.vt = &ssh_rsa;

    /*
     * We don't generate e; we just use a standard one always.
     */
    mp_int *exponent = mp_from_integer(RSA_EXPONENT);

    /*
     * Generate p and q: primes with combined length `bits', not
     * congruent to 1 modulo e. (Strictly speaking, we wanted (p-1)
     * and e to be coprime, and (q-1) and e to be coprime, but in
     * general that's slightly more fiddly to arrange. By choosing
     * a prime e, we can simplify the criterion.)
     *
     * We give a min_separation of 2 to invent_firstbits(), ensuring
     * that the two primes won't be very close to each other. (The
     * chance of them being _dangerously_ close is negligible - even
     * more so than an attacker guessing a whole 256-bit session key -
     * but it doesn't cost much to make sure.)
     */
    int qbits = bits / 2;
    int pbits = bits - qbits;
    assert(pbits >= qbits);

    RSAPrimeDetails pd = setup_rsa_prime(pbits, strong, pgc, prog);
    RSAPrimeDetails qd = setup_rsa_prime(qbits, strong, pgc, prog);
    progress_ready(prog);

    invent_firstbits(&pd.firstbits, &qd.firstbits, 2);

    mp_int *p = generate_rsa_prime(pd, pgc, prog);
    mp_int *q = generate_rsa_prime(qd, pgc, prog);

    /*
     * Ensure p > q, by swapping them if not.
     *
     * We only need to do this if the two primes were generated with
     * the same number of bits (i.e. if the requested key size is
     * even) - otherwise it's already guaranteed!
     */
    if (pbits == qbits) {
        mp_cond_swap(p, q, mp_cmp_hs(q, p));
    } else {
        assert(mp_cmp_hs(p, q));
    }

    /*
     * Now we have p, q and e. All we need to do now is work out
     * the other helpful quantities: n=pq, d=e^-1 mod (p-1)(q-1),
     * and (q^-1 mod p).
     */
    mp_int *modulus = mp_mul(p, q);
    mp_int *pm1 = mp_copy(p);
    mp_sub_integer_into(pm1, pm1, 1);
    mp_int *qm1 = mp_copy(q);
    mp_sub_integer_into(qm1, qm1, 1);
    mp_int *phi_n = mp_mul(pm1, qm1);
    mp_free(pm1);
    mp_free(qm1);
    mp_int *private_exponent = mp_invert(exponent, phi_n);
    mp_free(phi_n);
    mp_int *iqmp = mp_invert(q, p);

    /*
     * Populate the returned structure.
     */
    key->modulus = modulus;
    key->exponent = exponent;
    key->private_exponent = private_exponent;
    key->p = p;
    key->q = q;
    key->iqmp = iqmp;

    key->bits = mp_get_nbits(modulus);
    key->bytes = (key->bits + 7) / 8;

    return 1;
}